

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O2

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Rect::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Rect *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  const_iterator cVar2;
  MthdNop *pMVar3;
  MthdSolidFormat *pMVar4;
  MthdOperation *pMVar5;
  MthdVeryMissing *pMVar6;
  MthdCtxBeta *pMVar7;
  MthdCtxRop *pMVar8;
  MthdCtxPattern *pMVar9;
  MthdCtxClip *pMVar10;
  MthdDmaNotify *pMVar11;
  MthdPmTrigger *pMVar12;
  MthdPatch *pMVar13;
  result_type rVar14;
  MthdSolidColor *this_01;
  MthdVtxXy *this_02;
  MthdRect *this_03;
  MthdCtxSurf *this_04;
  MthdCtxSurf2D *this_05;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar15;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_00;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_01;
  allocator_type aStack_308;
  allocator local_307;
  allocator local_306;
  allocator local_305;
  allocator local_304;
  allocator local_303;
  allocator local_302;
  allocator local_301;
  allocator local_300;
  allocator local_2ff;
  allocator local_2fe;
  allocator local_2fd;
  allocator local_2fc;
  allocator local_2fb;
  allocator local_2fa;
  allocator local_2f9;
  MthdNop *local_2f8;
  const_iterator local_2f0;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_2e8;
  MthdSolidFormat *local_2e0;
  MthdOperation *local_2d8;
  MthdVeryMissing *local_2d0;
  MthdCtxBeta *local_2c8;
  MthdCtxRop *local_2c0;
  MthdCtxPattern *local_2b8;
  MthdCtxClip *local_2b0;
  MthdDmaNotify *local_2a8;
  MthdPmTrigger *local_2a0;
  MthdPatch *local_298;
  string local_290;
  MthdSolidColor *local_270;
  string local_268;
  string local_248;
  MthdDmaNotify *local_228;
  MthdCtxClip *local_220;
  MthdCtxPattern *local_218;
  MthdCtxRop *local_210;
  MthdCtxBeta *local_208;
  MthdVeryMissing *local_200;
  MthdOperation *local_1f8;
  MthdSolidFormat *local_1f0;
  MthdSolidColor *local_1e8;
  MthdVtxXy *local_1e0;
  MthdRect *local_1d8;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_2e8 = __return_storage_ptr__;
  local_2f8 = (MthdNop *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar14 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_290,"nop",&local_2f9);
  pMVar3 = local_2f8;
  opt = &(this->super_Class).opt;
  MthdNop::SingleMthdTest
            (local_2f8,opt,(uint32_t)rVar14,&local_290,-1,(this->super_Class).cls,0x100,1,4);
  local_248._M_dataplus._M_p = (pointer)pMVar3;
  local_2f0._M_current = (SingleMthdTest **)operator_new(0x25950);
  rVar14 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_268,"notify",&local_2fa);
  cVar2._M_current = local_2f0._M_current;
  MthdNotify::SingleMthdTest
            ((MthdNotify *)local_2f0._M_current,opt,(uint32_t)rVar14,&local_268,0,
             (this->super_Class).cls,0x104,1,4);
  local_248._M_string_length = (size_type)cVar2._M_current;
  local_298 = (MthdPatch *)operator_new(0x25950);
  rVar14 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1b0,"patch",&local_2fb);
  pMVar13 = local_298;
  MthdPatch::SingleMthdTest
            (local_298,opt,(uint32_t)rVar14,&local_1b0,-1,(this->super_Class).cls,0x10c,1,4);
  local_248.field_2._M_allocated_capacity = (size_type)pMVar13;
  local_2a0 = (MthdPmTrigger *)operator_new(0x25950);
  rVar14 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1d0,"pm_trigger",&local_2fc);
  pMVar12 = local_2a0;
  MthdPmTrigger::SingleMthdTest
            (local_2a0,opt,(uint32_t)rVar14,&local_1d0,-1,(this->super_Class).cls,0x140,1,4);
  local_248.field_2._8_8_ = pMVar12;
  local_2a8 = (MthdDmaNotify *)operator_new(0x25950);
  rVar14 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_50,"dma_notify",&local_2fd);
  pMVar11 = local_2a8;
  MthdDmaNotify::SingleMthdTest
            (local_2a8,opt,(uint32_t)rVar14,&local_50,1,(this->super_Class).cls,0x180,1,4);
  local_228 = pMVar11;
  local_2b0 = (MthdCtxClip *)operator_new(0x25950);
  rVar14 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_70,"ctx_clip",&local_2fe);
  pMVar10 = local_2b0;
  MthdCtxClip::SingleMthdTest
            (local_2b0,opt,(uint32_t)rVar14,&local_70,2,(this->super_Class).cls,0x184,1,4);
  local_220 = pMVar10;
  local_2b8 = (MthdCtxPattern *)operator_new(0x25958);
  rVar14 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_90,"ctx_pattern",&local_2ff);
  pMVar9 = local_2b8;
  uVar1 = (this->super_Class).cls;
  MthdCtxPattern::MthdCtxPattern
            (local_2b8,opt,(uint32_t)rVar14,&local_90,3,uVar1,0x188,uVar1 != 0x1e);
  local_218 = pMVar9;
  local_2c0 = (MthdCtxRop *)operator_new(0x25950);
  rVar14 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_b0,"ctx_rop",&local_300);
  pMVar8 = local_2c0;
  MthdCtxRop::SingleMthdTest
            (local_2c0,opt,(uint32_t)rVar14,&local_b0,4,(this->super_Class).cls,0x18c,1,4);
  local_210 = pMVar8;
  local_2c8 = (MthdCtxBeta *)operator_new(0x25950);
  rVar14 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_d0,"ctx_beta",&local_301);
  pMVar7 = local_2c8;
  MthdCtxBeta::SingleMthdTest
            (local_2c8,opt,(uint32_t)rVar14,&local_d0,5,(this->super_Class).cls,400,1,4);
  local_208 = pMVar7;
  local_2d0 = (MthdVeryMissing *)operator_new(0x25950);
  rVar14 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_f0,"missing",&local_302);
  pMVar6 = local_2d0;
  MthdVeryMissing::SingleMthdTest
            (local_2d0,opt,(uint32_t)rVar14,&local_f0,-1,(this->super_Class).cls,0x200,1,4);
  local_200 = pMVar6;
  local_2d8 = (MthdOperation *)operator_new(0x25958);
  rVar14 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_110,"operation",&local_303);
  pMVar5 = local_2d8;
  uVar1 = (this->super_Class).cls;
  MthdOperation::MthdOperation
            (local_2d8,opt,(uint32_t)rVar14,&local_110,8,uVar1,0x2fc,uVar1 != 0x1e);
  local_1f8 = pMVar5;
  local_2e0 = (MthdSolidFormat *)operator_new(0x25958);
  rVar14 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_130,"format",&local_304);
  pMVar4 = local_2e0;
  uVar1 = (this->super_Class).cls;
  MthdSolidFormat::MthdSolidFormat
            (local_2e0,opt,(uint32_t)rVar14,&local_130,9,uVar1,0x300,uVar1 != 0x1e);
  local_1f0 = pMVar4;
  this_01 = (MthdSolidColor *)operator_new(0x25950);
  local_270 = this_01;
  rVar14 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_150,"color",&local_305);
  MthdSolidColor::SingleMthdTest
            (this_01,opt,(uint32_t)rVar14,&local_150,10,(this->super_Class).cls,0x304,1,4);
  local_1e8 = this_01;
  this_02 = (MthdVtxXy *)operator_new(0x25958);
  rVar14 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_170,"rect.xy",&local_306);
  MthdVtxXy::MthdVtxXy
            (this_02,opt,(uint32_t)rVar14,&local_170,0xb,(this->super_Class).cls,0x400,0x10,8,1);
  local_1e0 = this_02;
  this_03 = (MthdRect *)operator_new(0x25958);
  rVar14 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_190,"rect.rect",&local_307);
  MthdRect::MthdRect(this_03,opt,(uint32_t)rVar14,&local_190,0xc,(this->super_Class).cls,0x404,0x10,
                     8,4);
  pvVar15 = local_2e8;
  __l._M_len = 0xf;
  __l._M_array = (iterator)&local_248;
  local_1d8 = this_03;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_2e8,__l,&aStack_308);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_290);
  cVar2._M_current =
       (pvVar15->
       super__Vector_base<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if ((this->super_Class).cls == 0x1e) {
    this_04 = (MthdCtxSurf *)operator_new(0x25958);
    rVar14 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    std::__cxx11::string::string((string *)&local_248,"ctx_dst",(allocator *)&local_268);
    pvVar15 = local_2e8;
    MthdCtxSurf::MthdCtxSurf
              (this_04,opt,(uint32_t)rVar14,&local_248,7,(this->super_Class).cls,0x194,0);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_290;
    local_290._M_dataplus._M_p = (pointer)this_04;
    std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
    ::insert(pvVar15,cVar2,__l_00);
  }
  else {
    local_2f8 = (MthdNop *)operator_new(0x25950);
    rVar14 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    local_2f0._M_current = cVar2._M_current;
    std::__cxx11::string::string((string *)&local_248,"ctx_beta4",(allocator *)&local_1b0);
    pMVar3 = local_2f8;
    MthdCtxBeta4::SingleMthdTest
              ((MthdCtxBeta4 *)local_2f8,opt,(uint32_t)rVar14,&local_248,6,(this->super_Class).cls,
               0x194,1,4);
    local_268._M_dataplus._M_p = (pointer)pMVar3;
    this_05 = (MthdCtxSurf2D *)operator_new(0x25958);
    rVar14 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    std::__cxx11::string::string((string *)&local_290,"ctx_surf2d",(allocator *)&local_1d0);
    pvVar15 = local_2e8;
    cVar2._M_current = local_2f0._M_current;
    MthdCtxSurf2D::MthdCtxSurf2D
              (this_05,opt,(uint32_t)rVar14,&local_290,7,(this->super_Class).cls,0x198,1);
    __l_01._M_len = 2;
    __l_01._M_array = (iterator)&local_268;
    local_268._M_string_length = (size_type)this_05;
    std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
    ::insert(pvVar15,cVar2,__l_01);
    std::__cxx11::string::~string((string *)&local_290);
  }
  std::__cxx11::string::~string((string *)&local_248);
  return pvVar15;
}

Assistant:

std::vector<SingleMthdTest *> Rect::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdCtxClip(opt, rnd(), "ctx_clip", 2, cls, 0x184),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 3, cls, 0x188, cls != 0x1e),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 4, cls, 0x18c),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 5, cls, 0x190),
		new MthdVeryMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdOperation(opt, rnd(), "operation", 8, cls, 0x2fc, cls != 0x1e),
		new MthdSolidFormat(opt, rnd(), "format", 9, cls, 0x300, cls != 0x1e),
		new MthdSolidColor(opt, rnd(), "color", 10, cls, 0x304),
		new MthdVtxXy(opt, rnd(), "rect.xy", 11, cls, 0x400, 0x10, 8, VTX_FIRST),
		new MthdRect(opt, rnd(), "rect.rect", 12, cls, 0x404, 0x10, 8, VTX_DRAW),
	};
	if (cls == 0x1e) {
		res.insert(res.end(), {
			new MthdCtxSurf(opt, rnd(), "ctx_dst", 7, cls, 0x194, 0),
		});
	} else {
		res.insert(res.end(), {
			new MthdCtxBeta4(opt, rnd(), "ctx_beta4", 6, cls, 0x194),
			new MthdCtxSurf2D(opt, rnd(), "ctx_surf2d", 7, cls, 0x198, SURF2D_NV10),
		});
	}
	return res;
}